

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTcNamedArgTab::generate(CTcNamedArgTab *this)

{
  ulong ofs;
  uint16_t tmp;
  size_t in_RCX;
  size_t __n;
  CTPNArg *pCVar1;
  ulong ofs_00;
  char buf [2];
  char buf_1 [2];
  char buf_2 [2];
  char buf_3 [2];
  char buf_4 [2];
  undefined2 local_3e;
  short local_3c [3];
  undefined2 local_36;
  short local_34;
  short local_32;
  
  CTcPrsNode::def_label_pos(this->lbl);
  CTcGenTarg::write_op(G_cg,'W');
  ofs = (G_cs->super_CTcDataStream).ofs_;
  local_3c[1] = 0;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(local_3c + 1),(void *)0x2,in_RCX);
  local_3c[2] = (short)this->cnt;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(local_3c + 2),(void *)0x2,in_RCX);
  ofs_00 = (G_cs->super_CTcDataStream).ofs_;
  pCVar1 = (this->arglist->super_CTPNArglistBase).list_;
  if (pCVar1 != (CTPNArg *)0x0) {
    do {
      if ((pCVar1->super_CTPNArgBase).name_.typ_ != TOKT_INVALID) {
        local_3e = 0;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_3e,(void *)0x2,in_RCX);
      }
      pCVar1 = (pCVar1->super_CTPNArgBase).next_arg_;
    } while (pCVar1 != (CTPNArg *)0x0);
  }
  local_36 = 0;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_36,(void *)0x2,in_RCX);
  pCVar1 = (this->arglist->super_CTPNArglistBase).list_;
  local_34 = (short)ofs_00;
  if (pCVar1 != (CTPNArg *)0x0) {
    do {
      if ((pCVar1->super_CTPNArgBase).name_.typ_ != TOKT_INVALID) {
        local_3c[0] = (short)(int)(G_cs->super_CTcDataStream).ofs_ - local_34;
        __n = 2;
        CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs_00,(char *)local_3c,2);
        CTcDataStream::write
                  (&G_cs->super_CTcDataStream,(int)(pCVar1->super_CTPNArgBase).name_.text_,
                   (void *)(pCVar1->super_CTPNArgBase).name_.text_len_,__n);
        ofs_00 = ofs_00 + 2;
      }
      pCVar1 = (pCVar1->super_CTPNArgBase).next_arg_;
    } while (pCVar1 != (CTPNArg *)0x0);
  }
  local_34 = (short)(int)(G_cs->super_CTcDataStream).ofs_ - local_34;
  CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs_00,(char *)&local_34,2);
  local_32 = ((short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)ofs) + -2;
  CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs,(char *)&local_32,2);
  return;
}

Assistant:

void generate()
    {
        /* define the label location and start the table */
        CTcPrsNode::def_label_pos(lbl);
        G_cg->write_op(OPC_NAMEDARGTAB);

        /* write a placeholder for the table size */
        ulong start = G_cs->get_ofs();
        G_cs->write2(0);

        /* write the number of arguments in the list */
        G_cs->write2(cnt);

        /* write placeholders for the index entries */
        ulong idx = G_cs->get_ofs(), idx0 = idx;
        for (CTPNArg *arg = arglist->get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg())
        {
            /* if it's a named argument, write an index placeholder */
            if (arg->is_named_param())
                G_cs->write2(0);
        }

        /* write a final index marker, for computing the last item's length */
        G_cs->write2(0);

        /* write the strings */
        for (CTPNArg *arg = arglist->get_arg_list_head() ; arg != 0 ;
             arg = arg->get_next_arg())
        {
            /* if it's a named argument, write it out */
            if (arg->is_named_param())
            {
                /* write its index pointer */
                G_cs->write2_at(idx, G_cs->get_ofs() - idx0);

                /* write the string */
                G_cs->write(arg->get_name(), arg->get_name_len());

                /* advance the index pointer */
                idx += 2;
            }
        }

        /* write the final index marker */
        G_cs->write2_at(idx, G_cs->get_ofs() - idx0);

        /* go back and fill in the table length prefix */
        G_cs->write2_at(start, G_cs->get_ofs() - start - 2);
    }